

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

RuleInfo * __thiscall
anon_unknown.dwarf_1cc25c::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyID keyID)

{
  BuildEngineDelegate *pBVar1;
  __node_ptr p_Var2;
  RuleInfo *pRVar3;
  __hash_code __code;
  pointer *__ptr;
  __uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_58;
  key_type local_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_50._value = keyID._value;
  p_Var2 = std::
           _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&(this->ruleInfos)._M_h,
                          keyID._value % (this->ruleInfos)._M_h._M_bucket_count,&local_50,
                          keyID._value);
  if (p_Var2 == (__node_ptr)0x0) {
    pBVar1 = this->delegate;
    (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[3])(local_48,this,keyID._value);
    (*pBVar1->_vptr_BuildEngineDelegate[3])(&local_58,pBVar1,local_48);
    pRVar3 = addRule(this,keyID,
                     (unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &local_58);
    if ((_Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)
        local_58._M_t.
        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
        super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl != (Rule *)0x0) {
      (**(code **)(*(long *)local_58._M_t.
                            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl + 8))
                ();
    }
    local_58._M_t.
    super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
    super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl =
         (tuple<llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)
         (_Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)0x0;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  else {
    pRVar3 = (RuleInfo *)
             ((long)&(p_Var2->
                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                     ._M_storage._M_storage + 8);
  }
  return pRVar3;
}

Assistant:

RuleInfo& getRuleInfoForKey(KeyID keyID) {
    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, we need to resolve the full key so we can request it from the
    // delegate.
    return addRule(keyID, delegate.lookupRule(getKeyForID(keyID)));
  }